

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

bool __thiscall Rml::Context::Render(Context *this)

{
  int iVar1;
  int iVar2;
  pointer pEVar3;
  ElementDocument *this_00;
  Vector2f local_20;
  Vector2i local_18;
  Context *local_10;
  Context *this_local;
  
  local_18 = this->dimensions;
  local_10 = this;
  RenderManager::PrepareRender(this->render_manager,local_18);
  pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
  Element::Render(pEVar3);
  if (this->drag_clone != (Element *)0x0) {
    this_00 = (ElementDocument *)
              ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator*
                        (&this->cursor_proxy);
    ElementDocument::UpdateDocument(this_00);
    pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                       (&this->cursor_proxy);
    iVar1 = Math::Clamp<int>((this->mouse_position).x,0,(this->dimensions).x);
    iVar2 = Math::Clamp<int>((this->mouse_position).y,0,(this->dimensions).y);
    Vector2<float>::Vector2(&local_20,(float)iVar1,(float)iVar2);
    Element::SetOffset(pEVar3,local_20,(Element *)0x0,false);
    pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                       (&this->cursor_proxy);
    Element::Render(pEVar3);
  }
  RenderManager::ResetState(this->render_manager);
  return true;
}

Assistant:

bool Context::Render()
{
	RMLUI_ZoneScoped;

	render_manager->PrepareRender(dimensions);

	root->Render();

	// Render the cursor proxy so that any attached drag clone will be rendered below the cursor.
	if (drag_clone)
	{
		static_cast<ElementDocument&>(*cursor_proxy).UpdateDocument();
		cursor_proxy->SetOffset(
			Vector2f((float)Math::Clamp(mouse_position.x, 0, dimensions.x), (float)Math::Clamp(mouse_position.y, 0, dimensions.y)), nullptr);
		cursor_proxy->Render();
	}

	render_manager->ResetState();

	return true;
}